

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to8.h
# Opt level: O3

void ncnn::im2col_sgemm_pack4to8_avx
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  int *piVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  long lVar30;
  undefined1 (*pauVar31) [32];
  int nn;
  int iVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  _func_int ***ppp_Var36;
  void **ppvVar37;
  float *pfVar38;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  undefined1 (*pauVar42) [16];
  long lVar43;
  int iVar44;
  long lVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  float zeros [8];
  undefined1 local_a8 [64];
  size_t local_68;
  Mat *local_60;
  void *local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar3 = bottom_im2col->w;
  uVar33 = (ulong)(int)uVar3;
  iVar32 = bottom_im2col->h;
  uVar41 = bottom_im2col->c;
  uVar4 = top_blob->c;
  local_68 = 0;
  local_a8._0_8_ = (Allocator *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_a8._24_4_ = 0;
  local_a8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  uVar14 = (uVar3 & 7) + (uVar3 >> 3);
  iVar44 = iVar32 * 8;
  if ((long)uVar33 < 8) {
    uVar14 = uVar3;
    iVar44 = iVar32;
  }
  local_a8._32_8_ = local_a8._0_8_;
  local_a8._40_4_ = local_a8._8_4_;
  local_a8._44_4_ = local_a8._12_4_;
  local_60 = _bias;
  Mat::create((Mat *)local_a8,iVar44,uVar41,uVar14,0x10,4,(Allocator *)opt);
  if (0 < (int)uVar3 >> 3) {
    lVar30 = 0x40;
    uVar35 = 0;
    do {
      if (0 < (int)uVar41) {
        ppp_Var36 = (_func_int ***)
                    ((long)(_func_int ***)local_a8._0_8_ + local_68 * uVar35 * local_a8._16_8_);
        uVar39 = 0;
        do {
          if (0 < iVar32) {
            pauVar42 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar39 + lVar30);
            iVar44 = iVar32;
            do {
              auVar11 = vunpcklps_avx(pauVar42[-4],pauVar42[-3]);
              auVar12 = vunpcklps_avx(pauVar42[-2],pauVar42[-1]);
              auVar7 = vunpckhps_avx(pauVar42[-4],pauVar42[-3]);
              auVar8 = vunpckhps_avx(pauVar42[-2],pauVar42[-1]);
              auVar5 = vmovlhps_avx(auVar11,auVar12);
              auVar12 = vunpckhpd_avx(auVar11,auVar12);
              auVar11 = vmovlhps_avx(auVar7,auVar8);
              auVar6 = vunpckhpd_avx(auVar7,auVar8);
              auVar8 = vunpcklps_avx(*pauVar42,pauVar42[1]);
              auVar13 = vunpcklps_avx(pauVar42[2],pauVar42[3]);
              auVar9 = vunpckhps_avx(*pauVar42,pauVar42[1]);
              auVar10 = vunpckhps_avx(pauVar42[2],pauVar42[3]);
              auVar7 = vmovlhps_avx(auVar8,auVar13);
              auVar13 = vunpckhpd_avx(auVar8,auVar13);
              auVar8 = vmovlhps_avx(auVar9,auVar10);
              auVar9 = vunpckhpd_avx(auVar9,auVar10);
              *(undefined1 (*) [16])ppp_Var36 = auVar5;
              *(undefined1 (*) [16])(ppp_Var36 + 2) = auVar7;
              *(undefined1 (*) [16])(ppp_Var36 + 4) = auVar12;
              *(undefined1 (*) [16])(ppp_Var36 + 6) = auVar13;
              *(undefined1 (*) [16])(ppp_Var36 + 8) = auVar11;
              *(undefined1 (*) [16])(ppp_Var36 + 10) = auVar8;
              *(undefined1 (*) [16])(ppp_Var36 + 0xc) = auVar6;
              *(undefined1 (*) [16])(ppp_Var36 + 0xe) = auVar9;
              ppp_Var36 = ppp_Var36 + 0x10;
              pauVar42 = (undefined1 (*) [16])(*pauVar42 + (long)(int)(uVar3 * 4) * 4);
              iVar44 = iVar44 + -1;
            } while (iVar44 != 0);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != uVar41);
      }
      uVar35 = uVar35 + 1;
      lVar30 = lVar30 + 0x80;
    } while (uVar35 != (uint)((int)uVar3 >> 3));
  }
  uVar35 = uVar33 & 0xfffffffffffffff8;
  if ((uint)uVar35 != uVar3) {
    lVar30 = uVar35 << 4;
    do {
      if (0 < (int)uVar41) {
        uVar14 = (uint)uVar35;
        uVar34 = uVar14 + 7;
        if (-1 < (int)uVar14) {
          uVar34 = uVar14;
        }
        ppp_Var36 = (_func_int ***)
                    ((long)(_func_int ***)local_a8._0_8_ +
                    (long)(int)(((int)uVar34 >> 3) + (uVar14 - (uVar34 & 0xfffffff8))) * local_68 *
                    local_a8._16_8_);
        uVar39 = 0;
        do {
          if (0 < iVar32) {
            pauVar42 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar39 + lVar30);
            iVar44 = iVar32;
            do {
              *(undefined1 (*) [16])ppp_Var36 = *pauVar42;
              ppp_Var36 = ppp_Var36 + 2;
              pauVar42 = (undefined1 (*) [16])(*pauVar42 + (long)(int)(uVar3 * 4) * 4);
              iVar44 = iVar44 + -1;
            } while (iVar44 != 0);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != uVar41);
      }
      uVar35 = uVar35 + 1;
      lVar30 = lVar30 + 0x10;
    } while ((long)uVar35 < (long)uVar33);
  }
  if (0 < (int)uVar4) {
    iVar32 = iVar32 * uVar41;
    uVar35 = 0;
    do {
      pauVar31 = (undefined1 (*) [32])
                 (top_blob->cstep * uVar35 * top_blob->elemsize + (long)top_blob->data);
      ppvVar37 = &local_60->data + uVar35 * 4;
      if (local_60 == (Mat *)0x0) {
        ppvVar37 = &local_58;
      }
      local_58 = (void *)0x0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      if ((int)uVar3 < 8) {
        uVar39 = 0;
      }
      else {
        lVar30 = 0;
        uVar40 = 0;
        do {
          auVar54 = *(undefined1 (*) [32])ppvVar37;
          auVar53 = auVar54;
          auVar52 = auVar54;
          auVar51 = auVar54;
          auVar50 = auVar54;
          auVar49 = auVar54;
          auVar48 = auVar54;
          auVar46 = auVar54;
          if (0 < iVar32 * 4) {
            lVar43 = local_68 * local_a8._16_8_ * lVar30;
            lVar45 = 0;
            iVar44 = iVar32 * 4;
            auVar47 = auVar54;
            auVar15 = auVar54;
            auVar16 = auVar54;
            auVar17 = auVar54;
            auVar18 = auVar54;
            auVar19 = auVar54;
            auVar28 = auVar54;
            auVar29 = auVar54;
            do {
              pfVar38 = (float *)((long)kernel->data +
                                 lVar45 + kernel->cstep * uVar35 * kernel->elemsize);
              fVar20 = *pfVar38;
              fVar21 = pfVar38[1];
              fVar22 = pfVar38[2];
              fVar23 = pfVar38[3];
              fVar24 = pfVar38[4];
              fVar25 = pfVar38[5];
              fVar26 = pfVar38[6];
              fVar1 = *(float *)((long)(_func_int ***)local_a8._0_8_ + lVar45 + lVar43);
              fVar2 = *(float *)((long)(_func_int ***)local_a8._0_8_ + lVar45 + lVar43 + 4);
              auVar54._0_4_ = fVar1 * fVar20 + auVar19._0_4_;
              auVar54._4_4_ = fVar1 * fVar21 + auVar19._4_4_;
              auVar54._8_4_ = fVar1 * fVar22 + auVar19._8_4_;
              auVar54._12_4_ = fVar1 * fVar23 + auVar19._12_4_;
              auVar54._16_4_ = fVar1 * fVar24 + auVar19._16_4_;
              auVar54._20_4_ = fVar1 * fVar25 + auVar19._20_4_;
              auVar54._24_4_ = fVar1 * fVar26 + auVar19._24_4_;
              auVar54._28_4_ = fVar1 + auVar19._28_4_;
              auVar53._0_4_ = fVar2 * fVar20 + auVar18._0_4_;
              auVar53._4_4_ = fVar2 * fVar21 + auVar18._4_4_;
              auVar53._8_4_ = fVar2 * fVar22 + auVar18._8_4_;
              auVar53._12_4_ = fVar2 * fVar23 + auVar18._12_4_;
              auVar53._16_4_ = fVar2 * fVar24 + auVar18._16_4_;
              auVar53._20_4_ = fVar2 * fVar25 + auVar18._20_4_;
              auVar53._24_4_ = fVar2 * fVar26 + auVar18._24_4_;
              auVar53._28_4_ = fVar1 + auVar18._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_a8._0_8_ + 8))->_vptr_Allocator +
                                lVar45 + lVar43);
              fVar2 = *(float *)((long)&((Allocator *)(local_a8._0_8_ + 8))->_vptr_Allocator +
                                lVar45 + lVar43 + 4);
              auVar52._0_4_ = fVar1 * fVar20 + auVar17._0_4_;
              auVar52._4_4_ = fVar1 * fVar21 + auVar17._4_4_;
              auVar52._8_4_ = fVar1 * fVar22 + auVar17._8_4_;
              auVar52._12_4_ = fVar1 * fVar23 + auVar17._12_4_;
              auVar52._16_4_ = fVar1 * fVar24 + auVar17._16_4_;
              auVar52._20_4_ = fVar1 * fVar25 + auVar17._20_4_;
              auVar52._24_4_ = fVar1 * fVar26 + auVar17._24_4_;
              auVar52._28_4_ = fVar1 + auVar17._28_4_;
              auVar51._0_4_ = fVar2 * fVar20 + auVar16._0_4_;
              auVar51._4_4_ = fVar2 * fVar21 + auVar16._4_4_;
              auVar51._8_4_ = fVar2 * fVar22 + auVar16._8_4_;
              auVar51._12_4_ = fVar2 * fVar23 + auVar16._12_4_;
              auVar51._16_4_ = fVar2 * fVar24 + auVar16._16_4_;
              auVar51._20_4_ = fVar2 * fVar25 + auVar16._20_4_;
              auVar51._24_4_ = fVar2 * fVar26 + auVar16._24_4_;
              auVar51._28_4_ = fVar1 + auVar16._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_a8._0_8_ + 0x10))->_vptr_Allocator +
                                lVar45 + lVar43);
              fVar2 = *(float *)((long)&((Allocator *)(local_a8._0_8_ + 0x10))->_vptr_Allocator +
                                lVar45 + lVar43 + 4);
              auVar50._0_4_ = fVar1 * fVar20 + auVar15._0_4_;
              auVar50._4_4_ = fVar1 * fVar21 + auVar15._4_4_;
              auVar50._8_4_ = fVar1 * fVar22 + auVar15._8_4_;
              auVar50._12_4_ = fVar1 * fVar23 + auVar15._12_4_;
              auVar50._16_4_ = fVar1 * fVar24 + auVar15._16_4_;
              auVar50._20_4_ = fVar1 * fVar25 + auVar15._20_4_;
              auVar50._24_4_ = fVar1 * fVar26 + auVar15._24_4_;
              auVar50._28_4_ = fVar1 + auVar15._28_4_;
              auVar49._0_4_ = fVar2 * fVar20 + auVar47._0_4_;
              auVar49._4_4_ = fVar2 * fVar21 + auVar47._4_4_;
              auVar49._8_4_ = fVar2 * fVar22 + auVar47._8_4_;
              auVar49._12_4_ = fVar2 * fVar23 + auVar47._12_4_;
              auVar49._16_4_ = fVar2 * fVar24 + auVar47._16_4_;
              auVar49._20_4_ = fVar2 * fVar25 + auVar47._20_4_;
              auVar49._24_4_ = fVar2 * fVar26 + auVar47._24_4_;
              auVar49._28_4_ = fVar1 + auVar47._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_a8._0_8_ + 0x18))->_vptr_Allocator +
                                lVar45 + lVar43);
              fVar2 = *(float *)((long)&((Allocator *)(local_a8._0_8_ + 0x18))->_vptr_Allocator +
                                lVar45 + lVar43 + 4);
              auVar48._0_4_ = fVar1 * fVar20 + auVar29._0_4_;
              auVar48._4_4_ = fVar1 * fVar21 + auVar29._4_4_;
              auVar48._8_4_ = fVar1 * fVar22 + auVar29._8_4_;
              auVar48._12_4_ = fVar1 * fVar23 + auVar29._12_4_;
              auVar48._16_4_ = fVar1 * fVar24 + auVar29._16_4_;
              auVar48._20_4_ = fVar1 * fVar25 + auVar29._20_4_;
              auVar48._24_4_ = fVar1 * fVar26 + auVar29._24_4_;
              auVar48._28_4_ = fVar1 + auVar29._28_4_;
              auVar46._0_4_ = fVar2 * fVar20 + auVar28._0_4_;
              auVar46._4_4_ = fVar2 * fVar21 + auVar28._4_4_;
              auVar46._8_4_ = fVar2 * fVar22 + auVar28._8_4_;
              auVar46._12_4_ = fVar2 * fVar23 + auVar28._12_4_;
              auVar46._16_4_ = fVar2 * fVar24 + auVar28._16_4_;
              auVar46._20_4_ = fVar2 * fVar25 + auVar28._20_4_;
              auVar46._24_4_ = fVar2 * fVar26 + auVar28._24_4_;
              auVar46._28_4_ = pfVar38[7] + auVar28._28_4_;
              lVar45 = lVar45 + 0x20;
              iVar44 = iVar44 + -1;
              auVar47 = auVar49;
              auVar15 = auVar50;
              auVar16 = auVar51;
              auVar17 = auVar52;
              auVar18 = auVar53;
              auVar19 = auVar54;
              auVar28 = auVar46;
              auVar29 = auVar48;
            } while (iVar44 != 0);
          }
          *pauVar31 = auVar54;
          pauVar31[1] = auVar53;
          pauVar31[2] = auVar52;
          pauVar31[3] = auVar51;
          pauVar31[4] = auVar50;
          pauVar31[5] = auVar49;
          pauVar31[6] = auVar48;
          pauVar31[7] = auVar46;
          pauVar31 = pauVar31 + 8;
          uVar39 = uVar40 + 8;
          lVar43 = uVar40 + 0xf;
          lVar30 = lVar30 + 1;
          uVar40 = uVar39;
        } while (lVar43 < (long)uVar33);
      }
      if ((int)uVar39 < (int)uVar3) {
        do {
          auVar47 = *(undefined1 (*) [32])ppvVar37;
          if (0 < iVar32 * 4) {
            pfVar38 = (float *)(kernel->cstep * uVar35 * kernel->elemsize + (long)kernel->data);
            lVar30 = 0;
            auVar54 = auVar47;
            do {
              fVar1 = *(float *)((long)(_func_int ***)local_a8._0_8_ +
                                lVar30 * 4 +
                                local_68 * local_a8._16_8_ *
                                (ulong)(((uint)uVar39 & 7) + ((uint)(uVar39 >> 3) & 0x1fffffff)));
              auVar47._0_4_ = fVar1 * *pfVar38 + auVar54._0_4_;
              auVar47._4_4_ = fVar1 * pfVar38[1] + auVar54._4_4_;
              auVar47._8_4_ = fVar1 * pfVar38[2] + auVar54._8_4_;
              auVar47._12_4_ = fVar1 * pfVar38[3] + auVar54._12_4_;
              auVar47._16_4_ = fVar1 * pfVar38[4] + auVar54._16_4_;
              auVar47._20_4_ = fVar1 * pfVar38[5] + auVar54._20_4_;
              auVar47._24_4_ = fVar1 * pfVar38[6] + auVar54._24_4_;
              auVar47._28_4_ = fVar1 + auVar54._28_4_;
              pfVar38 = pfVar38 + 8;
              lVar30 = lVar30 + 1;
              auVar54 = auVar47;
            } while (iVar32 * 4 != (int)lVar30);
          }
          *pauVar31 = auVar47;
          pauVar31 = pauVar31 + 1;
          uVar41 = (uint)uVar39 + 1;
          uVar39 = (ulong)uVar41;
        } while (uVar41 != uVar3);
      }
      uVar35 = uVar35 + 1;
    } while (uVar35 != uVar4);
  }
  piVar27 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar27 != (int *)0x0) {
    LOCK();
    *piVar27 = *piVar27 + -1;
    UNLOCK();
    if (*piVar27 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_a8._0_8_ != (Allocator *)0x0) {
          free((void *)local_a8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack4to8_avx(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 16u, 4, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + size % 8, 16u, 4, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 16u, 4, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x8
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r1);
                    _mm_store_ps(tmpptr + 4 * 3, _r5);
                    _mm_store_ps(tmpptr + 4 * 4, _r2);
                    _mm_store_ps(tmpptr + 4 * 5, _r6);
                    _mm_store_ps(tmpptr + 4 * 6, _r3);
                    _mm_store_ps(tmpptr + 4 * 7, _r7);

                    img0 += size * 4;
                    tmpptr += 32;
                }
            }
        }

        remain_size_start += nn_size << 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _val = _mm_load_ps(img0);
                    _mm_store_ps(tmpptr, _val);

                    img0 += size * 4;
                    tmpptr += 4;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 8 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;
            __m256 _sum4 = _sum0;
            __m256 _sum5 = _sum0;
            __m256 _sum6 = _sum0;
            __m256 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                __m256 _val4 = _mm256_broadcast_ss(tmpptr + 4);
                __m256 _val5 = _mm256_broadcast_ss(tmpptr + 5);
                _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                __m256 _val6 = _mm256_broadcast_ss(tmpptr + 6);
                __m256 _val7 = _mm256_broadcast_ss(tmpptr + 7);
                _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                kptr += 8;
                tmpptr += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 8 * 2, _sum2);
            _mm256_store_ps(outptr0 + 8 * 3, _sum3);
            _mm256_store_ps(outptr0 + 8 * 4, _sum4);
            _mm256_store_ps(outptr0 + 8 * 5, _sum5);
            _mm256_store_ps(outptr0 + 8 * 6, _sum6);
            _mm256_store_ps(outptr0 + 8 * 7, _sum7);

            outptr0 += 8 * 8;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);
                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

                kptr += 8;
                tmpptr += 1;
            }

            _mm256_store_ps(outptr0, _sum0);
            outptr0 += 8;
        }
    }
}